

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxValues
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *side,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minRes,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxRes,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minVal,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxVal)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Real RVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  long in_FS_OFFSET;
  byte bVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  double local_368;
  cpp_dec_float<200U,_int,_void> local_348;
  cpp_dec_float<200U,_int,_void> local_2c8;
  undefined4 local_248;
  uint uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar10 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&minVal->m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&maxVal->m_backend,0);
  pnVar8 = val;
  pnVar9 = &local_b0;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
    pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar10 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (val->m_backend).exp;
  local_b0.m_backend.neg = (val->m_backend).neg;
  local_b0.m_backend.fpclass = (val->m_backend).fpclass;
  local_b0.m_backend.prec_elem = (val->m_backend).prec_elem;
  local_1b8.m_backend.fpclass = cpp_dec_float_finite;
  local_1b8.m_backend.prec_elem = 0x1c;
  local_1b8.m_backend.data._M_elems[0] = 0;
  local_1b8.m_backend.data._M_elems[1] = 0;
  local_1b8.m_backend.data._M_elems[2] = 0;
  local_1b8.m_backend.data._M_elems[3] = 0;
  local_1b8.m_backend.data._M_elems[4] = 0;
  local_1b8.m_backend.data._M_elems[5] = 0;
  local_1b8.m_backend.data._M_elems[6] = 0;
  local_1b8.m_backend.data._M_elems[7] = 0;
  local_1b8.m_backend.data._M_elems[8] = 0;
  local_1b8.m_backend.data._M_elems[9] = 0;
  local_1b8.m_backend.data._M_elems[10] = 0;
  local_1b8.m_backend.data._M_elems[0xb] = 0;
  local_1b8.m_backend.data._M_elems[0xc] = 0;
  local_1b8.m_backend.data._M_elems[0xd] = 0;
  local_1b8.m_backend.data._M_elems[0xe] = 0;
  local_1b8.m_backend.data._M_elems[0xf] = 0;
  local_1b8.m_backend.data._M_elems[0x10] = 0;
  local_1b8.m_backend.data._M_elems[0x11] = 0;
  local_1b8.m_backend.data._M_elems[0x12] = 0;
  local_1b8.m_backend.data._M_elems[0x13] = 0;
  local_1b8.m_backend.data._M_elems[0x14] = 0;
  local_1b8.m_backend.data._M_elems[0x15] = 0;
  local_1b8.m_backend.data._M_elems[0x16] = 0;
  local_1b8.m_backend.data._M_elems[0x17] = 0;
  local_1b8.m_backend.data._M_elems[0x18] = 0;
  local_1b8.m_backend.data._M_elems[0x19] = 0;
  local_1b8.m_backend.data._M_elems._104_5_ = 0;
  local_1b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.m_backend.exp = 0;
  local_1b8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_1b8,0.0);
  pTVar1 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar3 = Tolerances::epsilon(pTVar1);
  bVar4 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_b0,&local_1b8,RVar3);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (bVar4) {
    ::soplex::infinity::__tls_init();
    local_368 = *(double *)(in_FS_OFFSET + -8);
    local_248 = SUB84(local_368,0);
    uStack_244 = (uint)((ulong)local_368 >> 0x20) ^ 0x80000000;
    local_2c8.fpclass = cpp_dec_float_finite;
    local_2c8.prec_elem = 0x1c;
    local_2c8.data._M_elems[0] = 0;
    local_2c8.data._M_elems[1] = 0;
    local_2c8.data._M_elems[2] = 0;
    local_2c8.data._M_elems[3] = 0;
    local_2c8.data._M_elems[4] = 0;
    local_2c8.data._M_elems[5] = 0;
    local_2c8.data._M_elems[6] = 0;
    local_2c8.data._M_elems[7] = 0;
    local_2c8.data._M_elems[8] = 0;
    local_2c8.data._M_elems[9] = 0;
    local_2c8.data._M_elems[10] = 0;
    local_2c8.data._M_elems[0xb] = 0;
    local_2c8.data._M_elems[0xc] = 0;
    local_2c8.data._M_elems[0xd] = 0;
    local_2c8.data._M_elems[0xe] = 0;
    local_2c8.data._M_elems[0xf] = 0;
    local_2c8.data._M_elems[0x10] = 0;
    local_2c8.data._M_elems[0x11] = 0;
    local_2c8.data._M_elems[0x12] = 0;
    local_2c8.data._M_elems[0x13] = 0;
    local_2c8.data._M_elems[0x14] = 0;
    local_2c8.data._M_elems[0x15] = 0;
    local_2c8.data._M_elems[0x16] = 0;
    local_2c8.data._M_elems[0x17] = 0;
    local_2c8.data._M_elems[0x18] = 0;
    local_2c8.data._M_elems[0x19] = 0;
    local_2c8.data._M_elems._104_5_ = 0;
    local_2c8.data._M_elems[0x1b]._1_3_ = 0;
    local_2c8.exp = 0;
    local_2c8.neg = false;
    uStack_240 = 0;
    uStack_23c = 0x80000000;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2c8,-local_368);
    if ((((minRes->m_backend).fpclass == cpp_dec_float_NaN) ||
        (local_2c8.fpclass == cpp_dec_float_NaN)) ||
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&minRes->m_backend,&local_2c8), 0 < iVar5)) {
      local_348.fpclass = cpp_dec_float_finite;
      local_348.prec_elem = 0x1c;
      local_348.data._M_elems[0] = 0;
      local_348.data._M_elems[1] = 0;
      local_348.data._M_elems[2] = 0;
      local_348.data._M_elems[3] = 0;
      local_348.data._M_elems[4] = 0;
      local_348.data._M_elems[5] = 0;
      local_348.data._M_elems[6] = 0;
      local_348.data._M_elems[7] = 0;
      local_348.data._M_elems[8] = 0;
      local_348.data._M_elems[9] = 0;
      local_348.data._M_elems[10] = 0;
      local_348.data._M_elems[0xb] = 0;
      local_348.data._M_elems[0xc] = 0;
      local_348.data._M_elems[0xd] = 0;
      local_348.data._M_elems[0xe] = 0;
      local_348.data._M_elems[0xf] = 0;
      local_348.data._M_elems[0x10] = 0;
      local_348.data._M_elems[0x11] = 0;
      local_348.data._M_elems[0x12] = 0;
      local_348.data._M_elems[0x13] = 0;
      local_348.data._M_elems[0x14] = 0;
      local_348.data._M_elems[0x15] = 0;
      local_348.data._M_elems[0x16] = 0;
      local_348.data._M_elems[0x17] = 0;
      local_348.data._M_elems[0x18] = 0;
      local_348.data._M_elems[0x19] = 0;
      local_348.data._M_elems._104_5_ = 0;
      local_348.data._M_elems[0x1b]._1_3_ = 0;
      local_348.exp = 0;
      local_348.neg = false;
      if (&local_348 == &minRes->m_backend) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_348,&side->m_backend);
        if (local_348.data._M_elems[0] != 0 || local_348.fpclass != cpp_dec_float_finite) {
          local_348.neg = (bool)(local_348.neg ^ 1);
        }
      }
      else {
        if (&local_348 != &side->m_backend) {
          pnVar8 = side;
          pcVar7 = &local_348;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&pcVar7->data)->data)._M_elems[0] =
                 (pnVar8->m_backend).data._M_elems[0];
            pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar10 * -2 + 1) * 4)
            ;
          }
          local_348.exp = (side->m_backend).exp;
          local_348.neg = (side->m_backend).neg;
          local_348.fpclass = (side->m_backend).fpclass;
          local_348.prec_elem = (side->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_348,&minRes->m_backend);
      }
      local_2c8.fpclass = cpp_dec_float_finite;
      local_2c8.prec_elem = 0x1c;
      local_2c8.data._M_elems[0] = 0;
      local_2c8.data._M_elems[1] = 0;
      local_2c8.data._M_elems[2] = 0;
      local_2c8.data._M_elems[3] = 0;
      local_2c8.data._M_elems[4] = 0;
      local_2c8.data._M_elems[5] = 0;
      local_2c8.data._M_elems[6] = 0;
      local_2c8.data._M_elems[7] = 0;
      local_2c8.data._M_elems[8] = 0;
      local_2c8.data._M_elems[9] = 0;
      local_2c8.data._M_elems[10] = 0;
      local_2c8.data._M_elems[0xb] = 0;
      local_2c8.data._M_elems[0xc] = 0;
      local_2c8.data._M_elems[0xd] = 0;
      local_2c8.data._M_elems[0xe] = 0;
      local_2c8.data._M_elems[0xf] = 0;
      local_2c8.data._M_elems[0x10] = 0;
      local_2c8.data._M_elems[0x11] = 0;
      local_2c8.data._M_elems[0x12] = 0;
      local_2c8.data._M_elems[0x13] = 0;
      local_2c8.data._M_elems[0x14] = 0;
      local_2c8.data._M_elems[0x15] = 0;
      local_2c8.data._M_elems[0x16] = 0;
      local_2c8.data._M_elems[0x17] = 0;
      local_2c8.data._M_elems[0x18] = 0;
      local_2c8.data._M_elems[0x19] = 0;
      local_2c8.data._M_elems._104_5_ = 0;
      local_2c8.data._M_elems[0x1b]._1_3_ = 0;
      local_2c8.exp = 0;
      local_2c8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_2c8,&local_348,&val->m_backend);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_2c8.fpclass = cpp_dec_float_finite;
      local_2c8.prec_elem = 0x1c;
      local_2c8.data._M_elems[0] = 0;
      local_2c8.data._M_elems[1] = 0;
      local_2c8.data._M_elems[2] = 0;
      local_2c8.data._M_elems[3] = 0;
      local_2c8.data._M_elems[4] = 0;
      local_2c8.data._M_elems[5] = 0;
      local_2c8.data._M_elems[6] = 0;
      local_2c8.data._M_elems[7] = 0;
      local_2c8.data._M_elems[8] = 0;
      local_2c8.data._M_elems[9] = 0;
      local_2c8.data._M_elems[10] = 0;
      local_2c8.data._M_elems[0xb] = 0;
      local_2c8.data._M_elems[0xc] = 0;
      local_2c8.data._M_elems[0xd] = 0;
      local_2c8.data._M_elems[0xe] = 0;
      local_2c8.data._M_elems[0xf] = 0;
      local_2c8.data._M_elems[0x10] = 0;
      local_2c8.data._M_elems[0x11] = 0;
      local_2c8.data._M_elems[0x12] = 0;
      local_2c8.data._M_elems[0x13] = 0;
      local_2c8.data._M_elems[0x14] = 0;
      local_2c8.data._M_elems[0x15] = 0;
      local_2c8.data._M_elems[0x16] = 0;
      local_2c8.data._M_elems[0x17] = 0;
      local_2c8.data._M_elems[0x18] = 0;
      local_2c8.data._M_elems[0x19] = 0;
      local_2c8.data._M_elems._104_5_ = 0;
      local_2c8.data._M_elems[0x1b]._1_3_ = 0;
      local_2c8.exp = 0;
      local_2c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2c8,(double)CONCAT44(uStack_244,local_248));
    }
    pcVar7 = &local_2c8;
    pnVar8 = minVal;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar10 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
    }
    (minVal->m_backend).exp = local_2c8.exp;
    (minVal->m_backend).neg = local_2c8.neg;
    (minVal->m_backend).fpclass = local_2c8.fpclass;
    (minVal->m_backend).prec_elem = local_2c8.prec_elem;
    ::soplex::infinity::__tls_init();
    local_2c8.fpclass = cpp_dec_float_finite;
    local_2c8.prec_elem = 0x1c;
    local_2c8.data._M_elems[0] = 0;
    local_2c8.data._M_elems[1] = 0;
    local_2c8.data._M_elems[2] = 0;
    local_2c8.data._M_elems[3] = 0;
    local_2c8.data._M_elems[4] = 0;
    local_2c8.data._M_elems[5] = 0;
    local_2c8.data._M_elems[6] = 0;
    local_2c8.data._M_elems[7] = 0;
    local_2c8.data._M_elems[8] = 0;
    local_2c8.data._M_elems[9] = 0;
    local_2c8.data._M_elems[10] = 0;
    local_2c8.data._M_elems[0xb] = 0;
    local_2c8.data._M_elems[0xc] = 0;
    local_2c8.data._M_elems[0xd] = 0;
    local_2c8.data._M_elems[0xe] = 0;
    local_2c8.data._M_elems[0xf] = 0;
    local_2c8.data._M_elems[0x10] = 0;
    local_2c8.data._M_elems[0x11] = 0;
    local_2c8.data._M_elems[0x12] = 0;
    local_2c8.data._M_elems[0x13] = 0;
    local_2c8.data._M_elems[0x14] = 0;
    local_2c8.data._M_elems[0x15] = 0;
    local_2c8.data._M_elems[0x16] = 0;
    local_2c8.data._M_elems[0x17] = 0;
    local_2c8.data._M_elems[0x18] = 0;
    local_2c8.data._M_elems[0x19] = 0;
    local_2c8.data._M_elems._104_5_ = 0;
    local_2c8.data._M_elems[0x1b]._1_3_ = 0;
    local_2c8.exp = 0;
    local_2c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2c8,local_368);
    if ((((maxRes->m_backend).fpclass != cpp_dec_float_NaN) &&
        (local_2c8.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&maxRes->m_backend,&local_2c8), -1 < iVar5)) {
LAB_0059194e:
      ::soplex::infinity::__tls_init();
      local_2c8.fpclass = cpp_dec_float_finite;
      local_2c8.prec_elem = 0x1c;
      local_2c8.data._M_elems[0] = 0;
      local_2c8.data._M_elems[1] = 0;
      local_2c8.data._M_elems[2] = 0;
      local_2c8.data._M_elems[3] = 0;
      local_2c8.data._M_elems[4] = 0;
      local_2c8.data._M_elems[5] = 0;
      local_2c8.data._M_elems[6] = 0;
      local_2c8.data._M_elems[7] = 0;
      local_2c8.data._M_elems[8] = 0;
      local_2c8.data._M_elems[9] = 0;
      local_2c8.data._M_elems[10] = 0;
      local_2c8.data._M_elems[0xb] = 0;
      local_2c8.data._M_elems[0xc] = 0;
      local_2c8.data._M_elems[0xd] = 0;
      local_2c8.data._M_elems[0xe] = 0;
      local_2c8.data._M_elems[0xf] = 0;
      local_2c8.data._M_elems[0x10] = 0;
      local_2c8.data._M_elems[0x11] = 0;
      local_2c8.data._M_elems[0x12] = 0;
      local_2c8.data._M_elems[0x13] = 0;
      local_2c8.data._M_elems[0x14] = 0;
      local_2c8.data._M_elems[0x15] = 0;
      local_2c8.data._M_elems[0x16] = 0;
      local_2c8.data._M_elems[0x17] = 0;
      local_2c8.data._M_elems[0x18] = 0;
      local_2c8.data._M_elems[0x19] = 0;
      local_2c8.data._M_elems._104_5_ = 0;
      local_2c8.data._M_elems[0x1b]._1_3_ = 0;
      local_2c8.exp = 0;
      local_2c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2c8,local_368);
      goto LAB_005919ec;
    }
    local_348.fpclass = cpp_dec_float_finite;
    local_348.prec_elem = 0x1c;
    local_348.data._M_elems[0] = 0;
    local_348.data._M_elems[1] = 0;
    local_348.data._M_elems[2] = 0;
    local_348.data._M_elems[3] = 0;
    local_348.data._M_elems[4] = 0;
    local_348.data._M_elems[5] = 0;
    local_348.data._M_elems[6] = 0;
    local_348.data._M_elems[7] = 0;
    local_348.data._M_elems[8] = 0;
    local_348.data._M_elems[9] = 0;
    local_348.data._M_elems[10] = 0;
    local_348.data._M_elems[0xb] = 0;
    local_348.data._M_elems[0xc] = 0;
    local_348.data._M_elems[0xd] = 0;
    local_348.data._M_elems[0xe] = 0;
    local_348.data._M_elems[0xf] = 0;
    local_348.data._M_elems[0x10] = 0;
    local_348.data._M_elems[0x11] = 0;
    local_348.data._M_elems[0x12] = 0;
    local_348.data._M_elems[0x13] = 0;
    local_348.data._M_elems[0x14] = 0;
    local_348.data._M_elems[0x15] = 0;
    local_348.data._M_elems[0x16] = 0;
    local_348.data._M_elems[0x17] = 0;
    local_348.data._M_elems[0x18] = 0;
    local_348.data._M_elems[0x19] = 0;
    local_348.data._M_elems._104_5_ = 0;
    local_348.data._M_elems[0x1b]._1_3_ = 0;
    local_348.exp = 0;
    local_348.neg = false;
    if (&local_348 != &maxRes->m_backend) {
      minRes = maxRes;
      if (&local_348 != &side->m_backend) {
        pnVar8 = side;
        pcVar7 = &local_348;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (((cpp_dec_float<200U,_int,_void> *)&pcVar7->data)->data)._M_elems[0] =
               (pnVar8->m_backend).data._M_elems[0];
          pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar10 * -2 + 1) * 4);
        }
        local_348.exp = (side->m_backend).exp;
        local_348.neg = (side->m_backend).neg;
        local_348.fpclass = (side->m_backend).fpclass;
        local_348.prec_elem = (side->m_backend).prec_elem;
      }
      goto LAB_005919a5;
    }
LAB_0059192d:
    local_348.fpclass = cpp_dec_float_finite;
    local_348.prec_elem = 0x1c;
    local_348.neg = false;
    local_348.exp = 0;
    local_348.data._M_elems[0x1b]._1_3_ = 0;
    local_348.data._M_elems._104_5_ = 0;
    local_348.data._M_elems[0x18] = 0;
    local_348.data._M_elems[0x19] = 0;
    local_348.data._M_elems[0x16] = 0;
    local_348.data._M_elems[0x17] = 0;
    local_348.data._M_elems[0x14] = 0;
    local_348.data._M_elems[0x15] = 0;
    local_348.data._M_elems[0x12] = 0;
    local_348.data._M_elems[0x13] = 0;
    local_348.data._M_elems[0x10] = 0;
    local_348.data._M_elems[0x11] = 0;
    local_348.data._M_elems[0xe] = 0;
    local_348.data._M_elems[0xf] = 0;
    local_348.data._M_elems[0xc] = 0;
    local_348.data._M_elems[0xd] = 0;
    local_348.data._M_elems[10] = 0;
    local_348.data._M_elems[0xb] = 0;
    local_348.data._M_elems[8] = 0;
    local_348.data._M_elems[9] = 0;
    local_348.data._M_elems[6] = 0;
    local_348.data._M_elems[7] = 0;
    local_348.data._M_elems[4] = 0;
    local_348.data._M_elems[5] = 0;
    local_348.data._M_elems[2] = 0;
    local_348.data._M_elems[3] = 0;
    local_348.data._M_elems[0] = 0;
    local_348.data._M_elems[1] = 0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&local_348,&side->m_backend);
    if (local_348.data._M_elems[0] != 0 || local_348.fpclass != cpp_dec_float_finite) {
      local_348.neg = (bool)(local_348.neg ^ 1);
    }
  }
  else {
    pnVar8 = val;
    pnVar9 = &local_130;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar10 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = (val->m_backend).exp;
    local_130.m_backend.neg = (val->m_backend).neg;
    local_130.m_backend.fpclass = (val->m_backend).fpclass;
    local_130.m_backend.prec_elem = (val->m_backend).prec_elem;
    local_238.m_backend.fpclass = cpp_dec_float_finite;
    local_238.m_backend.prec_elem = 0x1c;
    local_238.m_backend.data._M_elems[0] = 0;
    local_238.m_backend.data._M_elems[1] = 0;
    local_238.m_backend.data._M_elems[2] = 0;
    local_238.m_backend.data._M_elems[3] = 0;
    local_238.m_backend.data._M_elems[4] = 0;
    local_238.m_backend.data._M_elems[5] = 0;
    local_238.m_backend.data._M_elems[6] = 0;
    local_238.m_backend.data._M_elems[7] = 0;
    local_238.m_backend.data._M_elems[8] = 0;
    local_238.m_backend.data._M_elems[9] = 0;
    local_238.m_backend.data._M_elems[10] = 0;
    local_238.m_backend.data._M_elems[0xb] = 0;
    local_238.m_backend.data._M_elems[0xc] = 0;
    local_238.m_backend.data._M_elems[0xd] = 0;
    local_238.m_backend.data._M_elems[0xe] = 0;
    local_238.m_backend.data._M_elems[0xf] = 0;
    local_238.m_backend.data._M_elems[0x10] = 0;
    local_238.m_backend.data._M_elems[0x11] = 0;
    local_238.m_backend.data._M_elems[0x12] = 0;
    local_238.m_backend.data._M_elems[0x13] = 0;
    local_238.m_backend.data._M_elems[0x14] = 0;
    local_238.m_backend.data._M_elems[0x15] = 0;
    local_238.m_backend.data._M_elems[0x16] = 0;
    local_238.m_backend.data._M_elems[0x17] = 0;
    local_238.m_backend.data._M_elems[0x18] = 0;
    local_238.m_backend.data._M_elems[0x19] = 0;
    local_238.m_backend.data._M_elems._104_5_ = 0;
    local_238.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_238.m_backend.exp = 0;
    local_238.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_238,0.0);
    pTVar1 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var2 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    RVar3 = Tolerances::epsilon(pTVar1);
    bVar4 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_130,&local_238,RVar3);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (!bVar4) {
      return;
    }
    ::soplex::infinity::__tls_init();
    local_368 = *(double *)(in_FS_OFFSET + -8);
    local_2c8.fpclass = cpp_dec_float_finite;
    local_2c8.prec_elem = 0x1c;
    local_2c8.data._M_elems[0] = 0;
    local_2c8.data._M_elems[1] = 0;
    local_2c8.data._M_elems[2] = 0;
    local_2c8.data._M_elems[3] = 0;
    local_2c8.data._M_elems[4] = 0;
    local_2c8.data._M_elems[5] = 0;
    local_2c8.data._M_elems[6] = 0;
    local_2c8.data._M_elems[7] = 0;
    local_2c8.data._M_elems[8] = 0;
    local_2c8.data._M_elems[9] = 0;
    local_2c8.data._M_elems[10] = 0;
    local_2c8.data._M_elems[0xb] = 0;
    local_2c8.data._M_elems[0xc] = 0;
    local_2c8.data._M_elems[0xd] = 0;
    local_2c8.data._M_elems[0xe] = 0;
    local_2c8.data._M_elems[0xf] = 0;
    local_2c8.data._M_elems[0x10] = 0;
    local_2c8.data._M_elems[0x11] = 0;
    local_2c8.data._M_elems[0x12] = 0;
    local_2c8.data._M_elems[0x13] = 0;
    local_2c8.data._M_elems[0x14] = 0;
    local_2c8.data._M_elems[0x15] = 0;
    local_2c8.data._M_elems[0x16] = 0;
    local_2c8.data._M_elems[0x17] = 0;
    local_2c8.data._M_elems[0x18] = 0;
    local_2c8.data._M_elems[0x19] = 0;
    local_2c8.data._M_elems._104_5_ = 0;
    local_2c8.data._M_elems[0x1b]._1_3_ = 0;
    local_2c8.exp = 0;
    local_2c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2c8,local_368);
    if ((((maxRes->m_backend).fpclass == cpp_dec_float_NaN) ||
        (local_2c8.fpclass == cpp_dec_float_NaN)) ||
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&maxRes->m_backend,&local_2c8), iVar5 < 0)) {
      local_348.fpclass = cpp_dec_float_finite;
      local_348.prec_elem = 0x1c;
      local_348.data._M_elems[0] = 0;
      local_348.data._M_elems[1] = 0;
      local_348.data._M_elems[2] = 0;
      local_348.data._M_elems[3] = 0;
      local_348.data._M_elems[4] = 0;
      local_348.data._M_elems[5] = 0;
      local_348.data._M_elems[6] = 0;
      local_348.data._M_elems[7] = 0;
      local_348.data._M_elems[8] = 0;
      local_348.data._M_elems[9] = 0;
      local_348.data._M_elems[10] = 0;
      local_348.data._M_elems[0xb] = 0;
      local_348.data._M_elems[0xc] = 0;
      local_348.data._M_elems[0xd] = 0;
      local_348.data._M_elems[0xe] = 0;
      local_348.data._M_elems[0xf] = 0;
      local_348.data._M_elems[0x10] = 0;
      local_348.data._M_elems[0x11] = 0;
      local_348.data._M_elems[0x12] = 0;
      local_348.data._M_elems[0x13] = 0;
      local_348.data._M_elems[0x14] = 0;
      local_348.data._M_elems[0x15] = 0;
      local_348.data._M_elems[0x16] = 0;
      local_348.data._M_elems[0x17] = 0;
      local_348.data._M_elems[0x18] = 0;
      local_348.data._M_elems[0x19] = 0;
      local_348.data._M_elems._104_5_ = 0;
      local_348.data._M_elems[0x1b]._1_3_ = 0;
      local_348.exp = 0;
      local_348.neg = false;
      if (&local_348 == &maxRes->m_backend) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_348,&side->m_backend);
        if (local_348.data._M_elems[0] != 0 || local_348.fpclass != cpp_dec_float_finite) {
          local_348.neg = (bool)(local_348.neg ^ 1);
        }
      }
      else {
        if (&local_348 != &side->m_backend) {
          pnVar8 = side;
          pcVar7 = &local_348;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&pcVar7->data)->data)._M_elems[0] =
                 (pnVar8->m_backend).data._M_elems[0];
            pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar10 * -2 + 1) * 4)
            ;
          }
          local_348.exp = (side->m_backend).exp;
          local_348.neg = (side->m_backend).neg;
          local_348.fpclass = (side->m_backend).fpclass;
          local_348.prec_elem = (side->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_348,&maxRes->m_backend);
      }
      local_2c8.fpclass = cpp_dec_float_finite;
      local_2c8.prec_elem = 0x1c;
      local_2c8.data._M_elems[0] = 0;
      local_2c8.data._M_elems[1] = 0;
      local_2c8.data._M_elems[2] = 0;
      local_2c8.data._M_elems[3] = 0;
      local_2c8.data._M_elems[4] = 0;
      local_2c8.data._M_elems[5] = 0;
      local_2c8.data._M_elems[6] = 0;
      local_2c8.data._M_elems[7] = 0;
      local_2c8.data._M_elems[8] = 0;
      local_2c8.data._M_elems[9] = 0;
      local_2c8.data._M_elems[10] = 0;
      local_2c8.data._M_elems[0xb] = 0;
      local_2c8.data._M_elems[0xc] = 0;
      local_2c8.data._M_elems[0xd] = 0;
      local_2c8.data._M_elems[0xe] = 0;
      local_2c8.data._M_elems[0xf] = 0;
      local_2c8.data._M_elems[0x10] = 0;
      local_2c8.data._M_elems[0x11] = 0;
      local_2c8.data._M_elems[0x12] = 0;
      local_2c8.data._M_elems[0x13] = 0;
      local_2c8.data._M_elems[0x14] = 0;
      local_2c8.data._M_elems[0x15] = 0;
      local_2c8.data._M_elems[0x16] = 0;
      local_2c8.data._M_elems[0x17] = 0;
      local_2c8.data._M_elems[0x18] = 0;
      local_2c8.data._M_elems[0x19] = 0;
      local_2c8.data._M_elems._104_5_ = 0;
      local_2c8.data._M_elems[0x1b]._1_3_ = 0;
      local_2c8.exp = 0;
      local_2c8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_2c8,&local_348,&val->m_backend);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_2c8.fpclass = cpp_dec_float_finite;
      local_2c8.prec_elem = 0x1c;
      local_2c8.data._M_elems[0] = 0;
      local_2c8.data._M_elems[1] = 0;
      local_2c8.data._M_elems[2] = 0;
      local_2c8.data._M_elems[3] = 0;
      local_2c8.data._M_elems[4] = 0;
      local_2c8.data._M_elems[5] = 0;
      local_2c8.data._M_elems[6] = 0;
      local_2c8.data._M_elems[7] = 0;
      local_2c8.data._M_elems[8] = 0;
      local_2c8.data._M_elems[9] = 0;
      local_2c8.data._M_elems[10] = 0;
      local_2c8.data._M_elems[0xb] = 0;
      local_2c8.data._M_elems[0xc] = 0;
      local_2c8.data._M_elems[0xd] = 0;
      local_2c8.data._M_elems[0xe] = 0;
      local_2c8.data._M_elems[0xf] = 0;
      local_2c8.data._M_elems[0x10] = 0;
      local_2c8.data._M_elems[0x11] = 0;
      local_2c8.data._M_elems[0x12] = 0;
      local_2c8.data._M_elems[0x13] = 0;
      local_2c8.data._M_elems[0x14] = 0;
      local_2c8.data._M_elems[0x15] = 0;
      local_2c8.data._M_elems[0x16] = 0;
      local_2c8.data._M_elems[0x17] = 0;
      local_2c8.data._M_elems[0x18] = 0;
      local_2c8.data._M_elems[0x19] = 0;
      local_2c8.data._M_elems._104_5_ = 0;
      local_2c8.data._M_elems[0x1b]._1_3_ = 0;
      local_2c8.exp = 0;
      local_2c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2c8,-local_368);
    }
    pcVar7 = &local_2c8;
    pnVar8 = minVal;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar10 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
    }
    (minVal->m_backend).exp = local_2c8.exp;
    (minVal->m_backend).neg = local_2c8.neg;
    (minVal->m_backend).fpclass = local_2c8.fpclass;
    (minVal->m_backend).prec_elem = local_2c8.prec_elem;
    ::soplex::infinity::__tls_init();
    local_2c8.fpclass = cpp_dec_float_finite;
    local_2c8.prec_elem = 0x1c;
    local_2c8.data._M_elems[0] = 0;
    local_2c8.data._M_elems[1] = 0;
    local_2c8.data._M_elems[2] = 0;
    local_2c8.data._M_elems[3] = 0;
    local_2c8.data._M_elems[4] = 0;
    local_2c8.data._M_elems[5] = 0;
    local_2c8.data._M_elems[6] = 0;
    local_2c8.data._M_elems[7] = 0;
    local_2c8.data._M_elems[8] = 0;
    local_2c8.data._M_elems[9] = 0;
    local_2c8.data._M_elems[10] = 0;
    local_2c8.data._M_elems[0xb] = 0;
    local_2c8.data._M_elems[0xc] = 0;
    local_2c8.data._M_elems[0xd] = 0;
    local_2c8.data._M_elems[0xe] = 0;
    local_2c8.data._M_elems[0xf] = 0;
    local_2c8.data._M_elems[0x10] = 0;
    local_2c8.data._M_elems[0x11] = 0;
    local_2c8.data._M_elems[0x12] = 0;
    local_2c8.data._M_elems[0x13] = 0;
    local_2c8.data._M_elems[0x14] = 0;
    local_2c8.data._M_elems[0x15] = 0;
    local_2c8.data._M_elems[0x16] = 0;
    local_2c8.data._M_elems[0x17] = 0;
    local_2c8.data._M_elems[0x18] = 0;
    local_2c8.data._M_elems[0x19] = 0;
    local_2c8.data._M_elems._104_5_ = 0;
    local_2c8.data._M_elems[0x1b]._1_3_ = 0;
    local_2c8.exp = 0;
    local_2c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2c8,-local_368);
    if ((((minRes->m_backend).fpclass != cpp_dec_float_NaN) &&
        (local_2c8.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&minRes->m_backend,&local_2c8), iVar5 < 1)) goto LAB_0059194e;
    local_348.fpclass = cpp_dec_float_finite;
    local_348.prec_elem = 0x1c;
    local_348.data._M_elems[0] = 0;
    local_348.data._M_elems[1] = 0;
    local_348.data._M_elems[2] = 0;
    local_348.data._M_elems[3] = 0;
    local_348.data._M_elems[4] = 0;
    local_348.data._M_elems[5] = 0;
    local_348.data._M_elems[6] = 0;
    local_348.data._M_elems[7] = 0;
    local_348.data._M_elems[8] = 0;
    local_348.data._M_elems[9] = 0;
    local_348.data._M_elems[10] = 0;
    local_348.data._M_elems[0xb] = 0;
    local_348.data._M_elems[0xc] = 0;
    local_348.data._M_elems[0xd] = 0;
    local_348.data._M_elems[0xe] = 0;
    local_348.data._M_elems[0xf] = 0;
    local_348.data._M_elems[0x10] = 0;
    local_348.data._M_elems[0x11] = 0;
    local_348.data._M_elems[0x12] = 0;
    local_348.data._M_elems[0x13] = 0;
    local_348.data._M_elems[0x14] = 0;
    local_348.data._M_elems[0x15] = 0;
    local_348.data._M_elems[0x16] = 0;
    local_348.data._M_elems[0x17] = 0;
    local_348.data._M_elems[0x18] = 0;
    local_348.data._M_elems[0x19] = 0;
    local_348.data._M_elems._104_5_ = 0;
    local_348.data._M_elems[0x1b]._1_3_ = 0;
    local_348.exp = 0;
    local_348.neg = false;
    if (&local_348 == &minRes->m_backend) goto LAB_0059192d;
    if (&local_348 != &side->m_backend) {
      pnVar8 = side;
      pcVar7 = &local_348;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar7->data)->data)._M_elems[0] =
             (pnVar8->m_backend).data._M_elems[0];
        pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar10 * -2 + 1) * 4);
      }
      local_348.exp = (side->m_backend).exp;
      local_348.neg = (side->m_backend).neg;
      local_348.fpclass = (side->m_backend).fpclass;
      local_348.prec_elem = (side->m_backend).prec_elem;
    }
LAB_005919a5:
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&local_348,&minRes->m_backend);
  }
  local_2c8.fpclass = cpp_dec_float_finite;
  local_2c8.prec_elem = 0x1c;
  local_2c8.data._M_elems[0] = 0;
  local_2c8.data._M_elems[1] = 0;
  local_2c8.data._M_elems[2] = 0;
  local_2c8.data._M_elems[3] = 0;
  local_2c8.data._M_elems[4] = 0;
  local_2c8.data._M_elems[5] = 0;
  local_2c8.data._M_elems[6] = 0;
  local_2c8.data._M_elems[7] = 0;
  local_2c8.data._M_elems[8] = 0;
  local_2c8.data._M_elems[9] = 0;
  local_2c8.data._M_elems[10] = 0;
  local_2c8.data._M_elems[0xb] = 0;
  local_2c8.data._M_elems[0xc] = 0;
  local_2c8.data._M_elems[0xd] = 0;
  local_2c8.data._M_elems[0xe] = 0;
  local_2c8.data._M_elems[0xf] = 0;
  local_2c8.data._M_elems[0x10] = 0;
  local_2c8.data._M_elems[0x11] = 0;
  local_2c8.data._M_elems[0x12] = 0;
  local_2c8.data._M_elems[0x13] = 0;
  local_2c8.data._M_elems[0x14] = 0;
  local_2c8.data._M_elems[0x15] = 0;
  local_2c8.data._M_elems[0x16] = 0;
  local_2c8.data._M_elems[0x17] = 0;
  local_2c8.data._M_elems[0x18] = 0;
  local_2c8.data._M_elems[0x19] = 0;
  local_2c8.data._M_elems._104_5_ = 0;
  local_2c8.data._M_elems[0x1b]._1_3_ = 0;
  local_2c8.exp = 0;
  local_2c8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_2c8,&local_348,&val->m_backend);
LAB_005919ec:
  pcVar7 = &local_2c8;
  pnVar8 = maxVal;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar8->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
    pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar10 * -2 + 1) * 4);
    pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
  }
  (maxVal->m_backend).exp = local_2c8.exp;
  (maxVal->m_backend).neg = local_2c8.neg;
  (maxVal->m_backend).fpclass = local_2c8.fpclass;
  (maxVal->m_backend).prec_elem = local_2c8.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxValues(SPxLPBase<R>& lp, R side, R val, R minRes, R maxRes,
                                       R& minVal, R& maxVal)
{
   minVal = 0;
   maxVal = 0;

   if(LT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(minRes <= R(-infinity))
         minVal = R(-infinity);
      else
         minVal = (side - minRes) / val;

      if(maxRes >= R(infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - maxRes) / val;
   }
   else if(GT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(maxRes >= R(infinity))
         minVal = R(-infinity);
      else
         minVal = (side - maxRes) / val;

      if(minRes <= R(-infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - minRes) / val;
   }
}